

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnData::ColumnData
          (ColumnData *this,BlockManager *block_manager,DataTableInfo *info,idx_t column_index,
          idx_t start_row,LogicalType *type_p,optional_ptr<duckdb::ColumnData,_true> parent)

{
  __uniq_ptr_impl<duckdb::SegmentStatistics,_std::default_delete<duckdb::SegmentStatistics>_> __p;
  __uniq_ptr_impl<duckdb::SegmentStatistics,_std::default_delete<duckdb::SegmentStatistics>_>
  local_30;
  
  this->_vptr_ColumnData = (_func_int **)&PTR__ColumnData_027a7348;
  this->start = start_row;
  (this->count).super___atomic_base<unsigned_long>._M_i = 0;
  this->block_manager = block_manager;
  this->info = info;
  this->column_index = column_index;
  LogicalType::LogicalType(&this->type,type_p);
  (this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.finished_loading._M_base._M_i = true;
  (this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
  super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
  .
  super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
           super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
           .
           super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
           super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
           .
           super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.node_lock.super___mutex_base._M_mutex
  .__align = 0;
  *(undefined8 *)
   ((long)&(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.node_lock.super___mutex_base
           ._M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.node_lock.super___mutex_base
           ._M_mutex + 0x10) = 0;
  (this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.node_lock.super___mutex_base._M_mutex
  .__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.node_lock.super___mutex_base._M_mutex
  .__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->data).super_SegmentTree<duckdb::ColumnSegment,_false>._vptr_SegmentTree =
       (_func_int **)&PTR__SegmentTree_027a7bf8;
  (this->update_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->update_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->update_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->update_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->update_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->updates).
  super_unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>_>._M_t.
  super___uniq_ptr_impl<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::UpdateSegment_*,_std::default_delete<duckdb::UpdateSegment>_>.
  super__Head_base<0UL,_duckdb::UpdateSegment_*,_false>._M_head_impl = (UpdateSegment *)0x0;
  (this->stats_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->stats_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->stats_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->stats_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->stats_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->stats).
  super_unique_ptr<duckdb::SegmentStatistics,_std::default_delete<duckdb::SegmentStatistics>_>._M_t.
  super___uniq_ptr_impl<duckdb::SegmentStatistics,_std::default_delete<duckdb::SegmentStatistics>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::SegmentStatistics_*,_std::default_delete<duckdb::SegmentStatistics>_>
  .super__Head_base<0UL,_duckdb::SegmentStatistics_*,_false>._M_head_impl = (SegmentStatistics *)0x0
  ;
  this->allocation_size = 0;
  (this->parent).ptr = parent.ptr;
  (this->compression).ptr._M_b._M_p = (__pointer_type)0x0;
  if (parent.ptr == (ColumnData *)0x0) {
    make_uniq<duckdb::SegmentStatistics,duckdb::LogicalType&>((duckdb *)&local_30,&this->type);
    __p._M_t.
    super__Tuple_impl<0UL,_duckdb::SegmentStatistics_*,_std::default_delete<duckdb::SegmentStatistics>_>
    .super__Head_base<0UL,_duckdb::SegmentStatistics_*,_false>._M_head_impl =
         local_30._M_t.
         super__Tuple_impl<0UL,_duckdb::SegmentStatistics_*,_std::default_delete<duckdb::SegmentStatistics>_>
         .super__Head_base<0UL,_duckdb::SegmentStatistics_*,_false>._M_head_impl;
    local_30._M_t.
    super__Tuple_impl<0UL,_duckdb::SegmentStatistics_*,_std::default_delete<duckdb::SegmentStatistics>_>
    .super__Head_base<0UL,_duckdb::SegmentStatistics_*,_false>._M_head_impl =
         (tuple<duckdb::SegmentStatistics_*,_std::default_delete<duckdb::SegmentStatistics>_>)
         (_Tuple_impl<0UL,_duckdb::SegmentStatistics_*,_std::default_delete<duckdb::SegmentStatistics>_>
          )0x0;
    ::std::
    __uniq_ptr_impl<duckdb::SegmentStatistics,_std::default_delete<duckdb::SegmentStatistics>_>::
    reset((__uniq_ptr_impl<duckdb::SegmentStatistics,_std::default_delete<duckdb::SegmentStatistics>_>
           *)&this->stats,
          (pointer)__p._M_t.
                   super__Tuple_impl<0UL,_duckdb::SegmentStatistics_*,_std::default_delete<duckdb::SegmentStatistics>_>
                   .super__Head_base<0UL,_duckdb::SegmentStatistics_*,_false>._M_head_impl);
    ::std::unique_ptr<duckdb::SegmentStatistics,_std::default_delete<duckdb::SegmentStatistics>_>::
    ~unique_ptr((unique_ptr<duckdb::SegmentStatistics,_std::default_delete<duckdb::SegmentStatistics>_>
                 *)&local_30);
  }
  return;
}

Assistant:

ColumnData::ColumnData(BlockManager &block_manager, DataTableInfo &info, idx_t column_index, idx_t start_row,
                       LogicalType type_p, optional_ptr<ColumnData> parent)
    : start(start_row), count(0), block_manager(block_manager), info(info), column_index(column_index),
      type(std::move(type_p)), allocation_size(0), parent(parent) {
	if (!parent) {
		stats = make_uniq<SegmentStatistics>(type);
	}
}